

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

void fs_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  bool bVar7;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_188;
  undefined1 auStack_180 [32];
  undefined1 *apuStack_160 [16];
  code *pcStack_e0;
  undefined8 uStack_d0;
  code *pcStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  undefined1 auStack_b0 [128];
  
  if (((req->type != UV_FS) || (uVar3 = req->fs_type + UV_FS_UNKNOWN, 0x17 < uVar3)) ||
     (bVar7 = true, (0xd5c0efU >> (uVar3 & 0x1f) & 1) == 0)) {
    bVar7 = req->result == -0x7d;
  }
  if (bVar7) {
    uv_fs_req_cleanup();
    fs_cb_called = fs_cb_called + 1;
    return;
  }
  fs_cb_cold_1();
  iVar4 = (int)&uStack_c0;
  pcStack_c8 = (code *)0x1d4fb2;
  saturate_threadpool();
  pcStack_c8 = (code *)0x1d4fb7;
  uVar2 = uv_default_loop();
  pcStack_c8 = (code *)0x1d4fd5;
  iVar1 = uv_queue_work(uVar2,auStack_b0,abort,nop_done_cb);
  uStack_b8 = (ulong)iVar1;
  uStack_c0 = 0;
  if (uStack_b8 == 0) {
    pcStack_c8 = (code *)0x1d4ffd;
    iVar1 = uv_cancel(auStack_b0);
    uStack_b8 = (ulong)iVar1;
    uStack_c0 = 0;
    if (uStack_b8 != 0) goto LAB_001d5105;
    uStack_b8 = (ulong)done_cb_called;
    uStack_c0 = 0;
    if (uStack_b8 != 0) goto LAB_001d5112;
    lVar6 = 0;
    uStack_b8 = 0;
    do {
      pcStack_c8 = (code *)0x1d5050;
      uv_sem_post((long)pause_sems + lVar6);
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x80);
    pcStack_c8 = (code *)0x1d5067;
    iVar1 = uv_run(uVar2,0);
    uStack_b8 = (ulong)iVar1;
    uStack_c0 = 0;
    if (uStack_b8 != 0) goto LAB_001d511f;
    uStack_b8 = 1;
    uStack_c0 = (ulong)done_cb_called;
    if (uStack_c0 != 1) goto LAB_001d512c;
    pcStack_c8 = (code *)0x1d50b8;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_c8 = (code *)0x1d50c2;
    uv_run(uVar2,0);
    uStack_b8 = 0;
    pcStack_c8 = (code *)0x1d50d3;
    iVar1 = uv_loop_close(uVar2);
    uStack_c0 = (ulong)iVar1;
    if (uStack_b8 == uStack_c0) {
      pcStack_c8 = (code *)0x1d50e9;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_c8 = (code *)0x1d5105;
    run_test_threadpool_cancel_single_cold_1();
LAB_001d5105:
    pcStack_c8 = (code *)0x1d5112;
    run_test_threadpool_cancel_single_cold_2();
LAB_001d5112:
    pcStack_c8 = (code *)0x1d511f;
    run_test_threadpool_cancel_single_cold_3();
LAB_001d511f:
    pcStack_c8 = (code *)0x1d512c;
    run_test_threadpool_cancel_single_cold_4();
LAB_001d512c:
    pcStack_c8 = (code *)0x1d5139;
    run_test_threadpool_cancel_single_cold_5();
  }
  pcStack_c8 = nop_done_cb;
  run_test_threadpool_cancel_single_cold_6();
  pcStack_c8 = (code *)(long)iVar4;
  uStack_d0 = 0xffffffffffffff83;
  if (pcStack_c8 == (code *)0xffffffffffffff83) {
    done_cb_called = done_cb_called + 1;
    return;
  }
  pcStack_e0 = run_test_threadpool_cancel_when_busy;
  nop_done_cb_cold_1();
  apuStack_160[0] = auStack_180;
  pcStack_e0 = (code *)uVar2;
  iVar1 = uv_sem_init(apuStack_160[0],0);
  lStack_188 = (long)iVar1;
  if (lStack_188 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_queue_work(uVar2,apuStack_160,busy_cb,after_busy_cb);
    lStack_188 = (long)iVar1;
    if (lStack_188 != 0) goto LAB_001d52e8;
    uv_sem_wait(auStack_180);
    iVar1 = uv_cancel(apuStack_160);
    lStack_188 = (long)iVar1;
    if (lStack_188 != -0x10) goto LAB_001d52f5;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    lStack_188 = (long)iVar1;
    if (lStack_188 != 0) goto LAB_001d5302;
    lStack_188 = 1;
    if (done_cb_called == 1) {
      uv_sem_destroy(auStack_180);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_188 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (lStack_188 == iVar1) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001d531c;
    }
  }
  else {
    run_test_threadpool_cancel_when_busy_cold_1();
LAB_001d52e8:
    run_test_threadpool_cancel_when_busy_cold_2();
LAB_001d52f5:
    run_test_threadpool_cancel_when_busy_cold_3();
LAB_001d5302:
    run_test_threadpool_cancel_when_busy_cold_4();
  }
  run_test_threadpool_cancel_when_busy_cold_5();
LAB_001d531c:
  plVar5 = &lStack_188;
  run_test_threadpool_cancel_when_busy_cold_6();
  uv_sem_post(*plVar5);
  uv_sleep(10);
  return;
}

Assistant:

static void fs_cb(uv_fs_t* req) {
  ASSERT_NE(known_broken((uv_req_t*) req) || \
      req->result == UV_ECANCELED, 0);
  uv_fs_req_cleanup(req);
  fs_cb_called++;
}